

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix4.c
# Opt level: O1

char * test_matrix4_inverse(void)

{
  int iVar1;
  vector3 *pvVar2;
  matrix4 *pmVar3;
  char *pcVar4;
  vector3 scratchVector;
  matrix4 scratchMatrix;
  matrix4 inverted;
  matrix4 identity;
  matrix4 originalMatrix;
  vector3 local_230;
  matrix4 local_218;
  matrix4 local_198;
  matrix4 local_118;
  matrix4 local_98;
  
  matrix4_identity(&local_118);
  matrix4_identity(&local_98);
  pvVar2 = vector3_setf3(&local_230,0.5,0.5,0.5);
  pmVar3 = matrix4_make_transformation_scalingv3(&local_218,pvVar2);
  matrix4_multiply(&local_98,pmVar3);
  pvVar2 = vector3_setf3(&local_230,1.0,0.800000011920929,0.30000001192092896);
  pmVar3 = matrix4_make_transformation_translationv3(&local_218,pvVar2);
  matrix4_multiply(&local_98,pmVar3);
  pmVar3 = matrix4_set_from_euler_anglesf3_EXP
                     (&local_218,1.5707963705062866,1.5707963705062866,1.5707963705062866);
  matrix4_multiply(&local_98,pmVar3);
  pmVar3 = matrix4_set(&local_198,&local_98);
  pmVar3 = matrix4_invert(pmVar3);
  if (pmVar3 == (matrix4 *)0x0) {
    pcVar4 = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(660) : (assertion failed) ((hasInverse))"
    ;
  }
  else {
    matrix4_identity(&local_218);
    matrix4_multiply(&local_218,&local_198);
    matrix4_multiply(&local_218,&local_98);
    iVar1 = matrix4_equals(&local_118,&local_218);
    pcVar4 = (char *)0x0;
    if (iVar1 == 0) {
      pcVar4 = 
      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix4.c(666) : (assertion failed) ((matrix4_equals(&identity, &scratchMatrix)))"
      ;
    }
  }
  return pcVar4;
}

Assistant:

static char *test_matrix4_inverse(void)
{
	struct matrix4 originalMatrix;
	struct matrix4 identity;
	struct matrix4 inverted;
	struct vector3 scratchVector;
	struct matrix4 scratchMatrix;
	void *hasInverse = NULL;

	matrix4_identity(&identity);

	matrix4_identity(&originalMatrix);
	matrix4_multiply(&originalMatrix, matrix4_make_transformation_scalingv3(&scratchMatrix, vector3_setf3(&scratchVector, 0.5f, 0.5f, 0.5f)));
	matrix4_multiply(&originalMatrix, matrix4_make_transformation_translationv3(&scratchMatrix, vector3_setf3(&scratchVector, 1.0f, 0.8f, 0.3f)));
	matrix4_multiply(&originalMatrix, matrix4_set_from_euler_anglesf3_EXP(&scratchMatrix, HYP_TAU / 4.0f, HYP_TAU / 4.0f, HYP_TAU / 4.0f));

	hasInverse = matrix4_invert(matrix4_set(&inverted, &originalMatrix));

	test_assert(hasInverse);

	matrix4_identity(&scratchMatrix);
	matrix4_multiply(&scratchMatrix, &inverted);
	matrix4_multiply(&scratchMatrix, &originalMatrix);

	test_assert(matrix4_equals(&identity, &scratchMatrix));

	return NULL;
}